

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_draw_command * nk_draw_list_push_command(nk_draw_list *list,nk_rect clip,nk_handle texture)

{
  void *pvVar1;
  nk_size nVar2;
  nk_handle in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_size total;
  nk_byte *memory;
  nk_draw_command *cmd;
  nk_draw_command *local_8;
  
  local_8 = (nk_draw_command *)
            nk_buffer_alloc((nk_buffer *)texture.ptr,list._4_4_,(nk_size)cmd,(nk_size)memory);
  if (local_8 == (nk_draw_command *)0x0) {
    local_8 = (nk_draw_command *)0x0;
  }
  else {
    if (*(int *)(in_RDI + 0x1a) == 0) {
      pvVar1 = nk_buffer_memory((nk_buffer *)in_RDI[0x16]);
      nVar2 = nk_buffer_total((nk_buffer *)in_RDI[0x16]);
      in_RDI[0x1b] = (long)pvVar1 + (nVar2 - (long)local_8);
    }
    local_8->elem_count = 0;
    (local_8->clip_rect).x = (float)(int)in_XMM0_Qa;
    (local_8->clip_rect).y = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
    (local_8->clip_rect).w = (float)(int)in_XMM1_Qa;
    (local_8->clip_rect).h = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    local_8->texture = in_RSI;
    *(int *)(in_RDI + 0x1a) = *(int *)(in_RDI + 0x1a) + 1;
    *in_RDI = in_XMM0_Qa;
    in_RDI[1] = in_XMM1_Qa;
  }
  return local_8;
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_push_command(struct nk_draw_list *list, struct nk_rect clip,
nk_handle texture)
{
NK_STORAGE const nk_size cmd_align = NK_ALIGNOF(struct nk_draw_command);
NK_STORAGE const nk_size cmd_size = sizeof(struct nk_draw_command);
struct nk_draw_command *cmd;

NK_ASSERT(list);
cmd = (struct nk_draw_command*)
nk_buffer_alloc(list->buffer, NK_BUFFER_BACK, cmd_size, cmd_align);

if (!cmd) return 0;
if (!list->cmd_count) {
nk_byte *memory = (nk_byte*)nk_buffer_memory(list->buffer);
nk_size total = nk_buffer_total(list->buffer);
memory = nk_ptr_add(nk_byte, memory, total);
list->cmd_offset = (nk_size)(memory - (nk_byte*)cmd);
}

cmd->elem_count = 0;
cmd->clip_rect = clip;
cmd->texture = texture;
#ifdef NK_INCLUDE_COMMAND_USERDATA
cmd->userdata = list->userdata;
#endif

list->cmd_count++;
list->clip_rect = clip;
return cmd;
}